

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_pkware_decode.c
# Opt level: O2

zip_int64_t
pkware_decrypt(zip_source_t *src,void *ud,void *data,zip_uint64_t len,zip_source_cmd_t cmd)

{
  zip_pkware_keys_t *keys;
  zip_uint8_t *in;
  ulong uVar1;
  int iVar2;
  size_t len_00;
  zip_int64_t zVar3;
  zip_uint64_t len_01;
  zip_stat_t *st_1;
  zip_dostime_t local_70;
  zip_uint8_t header [12];
  zip_stat_t st;
  
  switch(cmd) {
  case ZIP_SOURCE_OPEN:
    keys = (zip_pkware_keys_t *)((long)ud + 8);
    _zip_pkware_keys_reset(keys);
    in = *ud;
    len_00 = strlen((char *)in);
    _zip_pkware_decrypt(keys,(zip_uint8_t *)0x0,in,len_00);
    zVar3 = zip_source_read(src,header,0xc);
    if (-1 < zVar3) {
      if (zVar3 == 0xc) {
        _zip_pkware_decrypt(keys,header,header,0xc);
        iVar2 = zip_source_stat(src,&st);
        if (iVar2 < 0) {
          return 0;
        }
        if (((byte)st.valid & 0x20) == 0) {
          return 0;
        }
        iVar2 = zip_source_get_dos_time(src,&local_70);
        if (iVar2 < 1) {
          if (((byte)st.valid & 0x10) == 0) {
            return 0;
          }
          iVar2 = _zip_u2d_time(st.mtime,&local_70,(zip_error_t *)((long)ud + 0x18));
          if (iVar2 < 0) {
            return -1;
          }
        }
        if (local_70.time._1_1_ == header[0xb]) {
          return 0;
        }
        if (st.crc._3_1_ == header[0xb]) {
          return 0;
        }
        iVar2 = 0x1b;
      }
      else {
        iVar2 = 0x11;
      }
      zip_error_set((zip_error_t *)((long)ud + 0x18),iVar2,0);
      return -1;
    }
    goto LAB_0010fffe;
  case ZIP_SOURCE_READ:
    len_01 = zip_source_read(src,data,len);
    if (-1 < (long)len_01) {
      _zip_pkware_decrypt((zip_pkware_keys_t *)((long)ud + 8),(zip_uint8_t *)data,
                          (zip_uint8_t *)data,len_01);
      return len_01;
    }
LAB_0010fffe:
    zip_error_set_from_source((zip_error_t *)((long)ud + 0x18),src);
    return -1;
  case ZIP_SOURCE_CLOSE:
    break;
  case ZIP_SOURCE_STAT:
    *(undefined2 *)((long)data + 0x36) = 0;
    uVar1 = *data;
    *(ulong *)data = uVar1 | 0x80;
    if ((uVar1 & 8) != 0) {
      *(long *)((long)data + 0x20) = *(long *)((long)data + 0x20) + -0xc;
    }
    break;
  case ZIP_SOURCE_ERROR:
    zVar3 = zip_error_to_data((zip_error_t *)((long)ud + 0x18),data,len);
    return zVar3;
  case ZIP_SOURCE_FREE:
    trad_pkware_free((trad_pkware *)ud);
    break;
  default:
    zVar3 = zip_source_pass_to_lower_layer(src,data,len,cmd);
    return zVar3;
  case ZIP_SOURCE_SUPPORTS:
    zVar3 = zip_source_make_command_bitmap(ZIP_SOURCE_OPEN,1,2,3,4,5,0x14,0xffffffff);
    return zVar3;
  }
  return 0;
}

Assistant:

static zip_int64_t
pkware_decrypt(zip_source_t *src, void *ud, void *data, zip_uint64_t len, zip_source_cmd_t cmd) {
    struct trad_pkware *ctx;
    zip_int64_t n;

    ctx = (struct trad_pkware *)ud;

    switch (cmd) {
    case ZIP_SOURCE_OPEN:
        _zip_pkware_keys_reset(&ctx->keys);
        _zip_pkware_decrypt(&ctx->keys, NULL, (const zip_uint8_t *)ctx->password, strlen(ctx->password));
        if (decrypt_header(src, ctx) < 0) {
            return -1;
        }
        return 0;

    case ZIP_SOURCE_READ:
        if ((n = zip_source_read(src, data, len)) < 0) {
            zip_error_set_from_source(&ctx->error, src);
            return -1;
        }

        _zip_pkware_decrypt(&ctx->keys, (zip_uint8_t *)data, (zip_uint8_t *)data, (zip_uint64_t)n);
        return n;

    case ZIP_SOURCE_CLOSE:
        return 0;

    case ZIP_SOURCE_STAT: {
        zip_stat_t *st;

        st = (zip_stat_t *)data;

        st->encryption_method = ZIP_EM_NONE;
        st->valid |= ZIP_STAT_ENCRYPTION_METHOD;
        if (st->valid & ZIP_STAT_COMP_SIZE) {
            st->comp_size -= ZIP_CRYPTO_PKWARE_HEADERLEN;
        }

        return 0;
    }

    case ZIP_SOURCE_SUPPORTS:
        return zip_source_make_command_bitmap(ZIP_SOURCE_OPEN, ZIP_SOURCE_READ, ZIP_SOURCE_CLOSE, ZIP_SOURCE_STAT, ZIP_SOURCE_ERROR, ZIP_SOURCE_FREE, ZIP_SOURCE_SUPPORTS_REOPEN, -1);

    case ZIP_SOURCE_ERROR:
        return zip_error_to_data(&ctx->error, data, len);

    case ZIP_SOURCE_FREE:
        trad_pkware_free(ctx);
        return 0;

    default:
        return zip_source_pass_to_lower_layer(src, data, len, cmd);
    }
}